

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O0

void __thiscall license::test::extend_license::test_method(extend_license *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  string *psVar3;
  lazy_ostream *plVar4;
  value_type *pvVar5;
  char *pcVar6;
  basic_cstring<const_char> local_540;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]> local_530;
  allocator local_509;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  assertion_result local_4e8;
  basic_cstring<const_char> local_4d0;
  basic_cstring<const_char> local_4c0;
  basic_cstring<const_char> local_4b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]> local_4a0;
  assertion_result local_480;
  basic_cstring<const_char> local_468;
  basic_cstring<const_char> local_458;
  allocator local_441;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  undefined1 local_3f0 [8];
  string new_date;
  License license_renew;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]> local_318;
  allocator local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  assertion_result local_2d0;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  undefined1 local_298 [8];
  CSimpleIniA ini;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]> local_220;
  assertion_result local_200;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  undefined1 local_128 [8];
  License license;
  string lic_location_str;
  path local_50;
  undefined1 local_30 [8];
  path licFile;
  extend_license *this_local;
  
  licFile.m_pathname.field_2._8_8_ = this;
  boost::filesystem::path::path(&local_50,"myclient.lic");
  boost::filesystem::operator/((path *)local_30,(path *)MyGlobalFixture::licenses_path,&local_50);
  boost::filesystem::path::~path(&local_50);
  psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)local_30);
  std::__cxx11::string::string
            ((string *)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)psVar3);
  psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)MyGlobalFixture::project_path);
  License::License((License *)local_128,
                   (string *)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   psVar3,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"valid-to",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"1929-11-11",&local_171);
  License::add_parameter((License *)local_128,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"client-signature",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"XXX-XXX-XXX",&local_1c1);
  License::add_parameter((License *)local_128,&local_198,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  License::write_license((License *)local_128);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
               ,0x87);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1d8,0x85,&local_1e8);
    bVar2 = boost::filesystem::exists((path *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_200,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_220,plVar4,(char (*) [25])"license has been created");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&ini.m_bStoreIsUtf8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
               ,0x87);
    boost::test_tools::tt_detail::report_assertion
              (&local_200,&local_220,&ini.m_bStoreIsUtf8,0x85,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>::
    ~lazy_ostream_impl(&local_220);
    boost::test_tools::assertion_result::~assertion_result(&local_200);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_298,false,
             false,false);
  pvVar5 = boost::filesystem::path::c_str((path *)local_30);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_298,pvVar5);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
               ,0x87);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2a8,0x88,&local_2b8);
    pcVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                       ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                        local_298,"TEST_PROJECT","valid-to",(char *)0x0,(bool *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,pcVar6,&local_2f1);
    bVar2 = std::operator==(&local_2f0,"1929-11-11");
    boost::test_tools::assertion_result::assertion_result(&local_2d0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_318,plVar4,(char (*) [17])"Date was written");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &license_renew.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
               ,0x87);
    boost::test_tools::tt_detail::report_assertion
              (&local_2d0,&local_318,
               &license_renew.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count,0x88,1,1,0
              );
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>::
    ~lazy_ostream_impl(&local_318);
    boost::test_tools::assertion_result::~assertion_result(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)MyGlobalFixture::project_path);
  License::License((License *)((long)&new_date.field_2 + 8),
                   (string *)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   psVar3,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_3f0,"2020-05-01",&local_3f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"valid-to",&local_419);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,pcVar6,&local_441);
  License::add_parameter((License *)((long)&new_date.field_2 + 8),&local_418,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  License::write_license((License *)((long)&new_date.field_2 + 8));
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_298);
  pvVar5 = boost::filesystem::path::c_str((path *)local_30);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_298,pvVar5);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_458,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
               ,0x87);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_468);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_458,0x90,&local_468);
    pcVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                       ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                        local_298,"TEST_PROJECT","valid-to",(char *)0x0,(bool *)0x0);
    bVar2 = std::operator==(pcVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3f0);
    boost::test_tools::assertion_result::assertion_result(&local_480,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4a0,plVar4,(char (*) [17])"license extended");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
               ,0x87);
    boost::test_tools::tt_detail::report_assertion(&local_480,&local_4a0,&local_4b0,0x90,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>::
    ~lazy_ostream_impl(&local_4a0);
    boost::test_tools::assertion_result::~assertion_result(&local_480);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
               ,0x87);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_4c0,0x92,&local_4d0);
    pcVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                       ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                        local_298,"TEST_PROJECT","client-signature",(char *)0x0,(bool *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_508,"XXX-XXX-XXX",&local_509);
    bVar2 = std::operator==(pcVar6,&local_508);
    boost::test_tools::assertion_result::assertion_result(&local_4e8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_530,plVar4,(char (*) [17])"license extended");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_540,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
               ,0x87);
    boost::test_tools::tt_detail::report_assertion(&local_4e8,&local_530,&local_540,0x92,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>::
    ~lazy_ostream_impl(&local_530);
    boost::test_tools::assertion_result::~assertion_result(&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_3f0);
  License::~License((License *)((long)&new_date.field_2 + 8));
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_298);
  License::~License((License *)local_128);
  std::__cxx11::string::~string
            ((string *)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  boost::filesystem::path::~path((path *)local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(extend_license) {
	const fs::path licFile = MyGlobalFixture::licenses_path / "myclient.lic";
	const string lic_location_str = licFile.string();
	License license(&lic_location_str, MyGlobalFixture::project_path.string());
	license.add_parameter(PARAM_EXPIRY_DATE, "1929-11-11");
	license.add_parameter(PARAM_CLIENT_SIGNATURE, "XXX-XXX-XXX");
	license.write_license();
	BOOST_REQUIRE_MESSAGE(fs::exists(licFile), "license has been created");
	CSimpleIniA ini;
	ini.LoadFile(licFile.c_str());
	BOOST_CHECK_MESSAGE(string(ini.GetValue("TEST_PROJECT", PARAM_EXPIRY_DATE)) == "1929-11-11", "Date was written");

	License license_renew(&lic_location_str, MyGlobalFixture::project_path.string());
	const string new_date("2020-05-01");
	license_renew.add_parameter(PARAM_EXPIRY_DATE, new_date.c_str());
	license_renew.write_license();
	ini.Reset();
	ini.LoadFile(licFile.c_str());
	BOOST_CHECK_MESSAGE(ini.GetValue("TEST_PROJECT", PARAM_EXPIRY_DATE) == new_date, "license extended");
	BOOST_CHECK_MESSAGE(ini.GetValue("TEST_PROJECT", PARAM_CLIENT_SIGNATURE) == string("XXX-XXX-XXX"),
						"license extended");
}